

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_GT_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_GT_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  int *in_R9;
  AssertionHelper local_7e0;
  Fixed local_7b0;
  char local_624 [4];
  undefined1 local_620 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_5f0 [4];
  int x_3;
  Fixed local_5c0;
  char local_434 [4];
  undefined1 local_430 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_400 [4];
  int x_2;
  Fixed local_3d0;
  char local_244 [4];
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  int x_1;
  Fixed local_1e0;
  char local_44 [4];
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int x;
  iu_GTestSyntaxTest_x_iutest_x_GT_Test *this_local;
  
  iutest_ar._36_4_ = 1;
  iutest::detail::AlwaysZero();
  local_44[0] = '\x02';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  iutest::internal::CmpHelperGT<int,int>
            ((AssertionResult *)local_40,(internal *)0x5516c7,"x",local_44,
             (int *)&iutest_ar.field_0x24,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1e0,iutest_ar._36_4_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&x_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xa2,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&x_1,pFVar2);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&x_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = true;
    iutest_ar_1._33_3_ = 0;
    iutest::detail::AlwaysZero();
    local_244[0] = '\x02';
    local_244[1] = '\0';
    local_244[2] = '\0';
    local_244[3] = '\0';
    iutest::internal::CmpHelperGT<int,int>
              ((AssertionResult *)local_240,(internal *)0x5516c7,"x",local_244,
               (int *)&iutest_ar_1.m_result,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3d0,iutest_ar_1._32_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_400,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xa4,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_400,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_400);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    iutest_ar_2._36_4_ = 1;
    iutest::detail::AlwaysZero();
    local_434[0] = '\x02';
    local_434[1] = '\0';
    local_434[2] = '\0';
    local_434[3] = '\0';
    iutest::internal::CmpHelperGT<int,int>
              ((AssertionResult *)local_430,(internal *)0x5516c7,"x",local_434,
               (int *)&iutest_ar_2.field_0x24,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
    if (!bVar1) {
      memset(&local_5c0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5c0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5c0,iutest_ar_2._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_430);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_5f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xa6,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_5f0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_5f0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5c0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_430);
    iutest_ar_3._36_4_ = 1;
    iutest::detail::AlwaysZero();
    local_624[0] = '\x02';
    local_624[1] = '\0';
    local_624[2] = '\0';
    local_624[3] = '\0';
    iutest::internal::CmpHelperGT<int,int>
              ((AssertionResult *)local_620,(internal *)0x5516c7,"x",local_624,
               (int *)&iutest_ar_3.field_0x24,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
    if (!bVar1) {
      memset(&local_7b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7b0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7b0,iutest_ar_3._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_620);
      iutest::AssertionHelper::AssertionHelper
                (&local_7e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xa8,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7e0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7e0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7b0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  }
  return;
}

Assistant:

TEST(GTestSyntaxTest, GT)
{
    if( int x = 1 )
        ASSERT_GT(2, x) << x;
    if( int x = 1 )
        EXPECT_GT(2, x) << x;
    if( int x = 1 )
        INFORM_GT(2, x) << x;
    if( int x = 1 )
        ASSUME_GT(2, x) << x;
}